

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CAdES.h
# Opt level: O0

size_t __thiscall Holder::SetDataSize(Holder *this)

{
  size_t sVar1;
  size_t sVar2;
  size_t sVar3;
  Holder *this_local;
  
  sVar1 = DerBase::EncodedSize(&(this->baseCertificateID).super_DerBase);
  sVar2 = DerBase::EncodedSize(&(this->entityName).super_DerBase);
  sVar3 = DerBase::EncodedSize(&(this->objectDigestInfo).super_DerBase);
  (this->super_DerBase).cbData = sVar1 + sVar2 + sVar3;
  return (this->super_DerBase).cbData;
}

Assistant:

virtual size_t SetDataSize() override
	{
		cbData = baseCertificateID.EncodedSize() + entityName.EncodedSize() + objectDigestInfo.EncodedSize();
		return cbData;
	}